

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O1

int runChild(char **cmd,int state,int exception,int value,int share,int output,int delay,
            double timeout,int poll,int repeat,int disown,int createNewGroup,uint interruptDelay)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  cmsysProcess *cp;
  char *pcVar3;
  double *userTimeout;
  uint uVar4;
  bool bVar5;
  int length;
  int local_74;
  uint local_70;
  uint local_6c;
  char *local_68;
  FILE *local_60;
  uint local_54;
  double local_50;
  char **local_48;
  ulong local_40;
  double local_38;
  
  local_70 = state;
  local_6c = share;
  local_50 = timeout;
  local_48 = cmd;
  cp = cmsysProcess_New();
  if (cp == (cmsysProcess *)0x0) {
    runChild_cold_1();
    uVar2 = 1;
  }
  else {
    if (repeat < 1) {
      uVar2 = 1;
    }
    else {
      userTimeout = &local_38;
      if (poll == 0) {
        userTimeout = (double *)0x0;
      }
      local_54 = disown | local_6c;
      do {
        local_40 = (ulong)(uint)repeat;
        local_68 = (char *)0x0;
        local_74 = 0;
        local_38 = 0.0;
        cmsysProcess_SetCommand(cp,local_48);
        if (0.0 <= local_50) {
          cmsysProcess_SetTimeout(cp,local_50);
        }
        if (local_6c != 0) {
          cmsysProcess_SetPipeShared(cp,2,1);
          cmsysProcess_SetPipeShared(cp,3,1);
        }
        if (disown != 0) {
          cmsysProcess_SetOption(cp,1,1);
        }
        if (createNewGroup != 0) {
          cmsysProcess_SetOption(cp,4,1);
        }
        cmsysProcess_Execute(cp);
        if (interruptDelay != 0) {
          sleep(interruptDelay);
          cmsysProcess_Interrupt(cp);
        }
        uVar4 = poll;
        if (local_54 == 0) {
          iVar1 = cmsysProcess_WaitForData(cp,&local_68,&local_74,userTimeout);
          while (iVar1 != 0) {
            uVar2 = uVar4;
            if (output != 0) {
              if (iVar1 == 0xff && uVar4 != 0) {
                fwrite("WaitForData timeout reached.\n",0x1d,1,_stdout);
                fflush(_stdout);
                uVar2 = uVar4 + 1;
                if (0x12 < (int)uVar4) {
                  fprintf(_stdout,"Poll count reached limit %d.\n",0x14);
                  cmsysProcess_Kill(cp);
                }
              }
              else {
                fwrite(local_68,1,(long)local_74,_stdout);
                fflush(_stdout);
              }
            }
            if (uVar2 != 0) {
              usleep(100000);
            }
            iVar1 = cmsysProcess_WaitForData(cp,&local_68,&local_74,userTimeout);
            uVar4 = uVar2;
          }
        }
        if (disown == 0) {
          cmsysProcess_WaitForExit(cp,(double *)0x0);
        }
        else {
          cmsysProcess_Disown(cp);
        }
        iVar1 = cmsysProcess_GetState(cp);
        switch(iVar1) {
        case 0:
          pcVar3 = "No process has been executed.";
          break;
        case 1:
          pcVar3 = cmsysProcess_GetErrorString(cp);
          bVar5 = false;
          printf("Error in administrating child process: [%s]\n",pcVar3);
          goto LAB_001030be;
        case 2:
          pcVar3 = cmsysProcess_GetExceptionString(cp);
          printf("Subprocess terminated abnormally: %s\n",pcVar3);
          goto LAB_00103053;
        case 3:
          pcVar3 = "The process is still executing.";
          break;
        case 4:
          uVar2 = cmsysProcess_GetExitValue(cp);
          printf("Subprocess exited with value = %d\n",(ulong)uVar2);
LAB_00103053:
          iVar1 = cmsysProcess_GetExitException(cp);
          bVar5 = true;
          if (iVar1 == exception) {
            iVar1 = cmsysProcess_GetExitValue(cp);
            bVar5 = iVar1 != value;
          }
          goto LAB_001030be;
        case 5:
          pcVar3 = "Subprocess was killed when timeout expired.";
          break;
        case 6:
          pcVar3 = "Subprocess was killed by parent.";
          break;
        case 7:
          pcVar3 = "Subprocess was disowned.";
          break;
        default:
          goto switchD_00103012_default;
        }
        puts(pcVar3);
switchD_00103012_default:
        bVar5 = false;
LAB_001030be:
        if (bVar5 != false) {
          iVar1 = cmsysProcess_GetExitException(cp);
          if (iVar1 != exception) {
            local_60 = _stderr;
            uVar2 = cmsysProcess_GetExitException(cp);
            fprintf(local_60,"Mismatch in exit exception.  Should have been %d, was %d.\n",
                    (ulong)(uint)exception,(ulong)uVar2);
          }
          iVar1 = cmsysProcess_GetExitValue(cp);
          if (iVar1 != value) {
            local_60 = _stderr;
            uVar2 = cmsysProcess_GetExitValue(cp);
            fprintf(local_60,"Mismatch in exit value.  Should have been %d, was %d.\n",
                    (ulong)(uint)value,(ulong)uVar2);
          }
        }
        uVar2 = cmsysProcess_GetState(cp);
        __stream = _stderr;
        if (uVar2 == local_70) {
          uVar2 = (uint)bVar5;
        }
        else {
          uVar2 = cmsysProcess_GetState(cp);
          fprintf(__stream,"Mismatch in state.  Should have been %d, was %d.\n",(ulong)local_70,
                  (ulong)uVar2);
          uVar2 = 1;
        }
        if ((int)uVar4 < 5 && uVar4 != 0) {
          fprintf(_stderr,"Poll count is %d, which is less than %d.\n",(ulong)uVar4,5);
          uVar2 = 1;
        }
        if (uVar2 != 0) goto LAB_001031ff;
        repeat = (int)local_40 - 1;
      } while (1 < (int)local_40);
      uVar2 = 0;
    }
LAB_001031ff:
    cmsysProcess_Delete(cp);
  }
  return uVar2;
}

Assistant:

int runChild(const char* cmd[], int state, int exception, int value, int share,
             int output, int delay, double timeout, int poll, int repeat,
             int disown, int createNewGroup, unsigned int interruptDelay)
{
  int result = 1;
  kwsysProcess* kp = kwsysProcess_New();
  if (!kp) {
    fprintf(stderr, "kwsysProcess_New returned NULL!\n");
    return 1;
  }
  while (repeat-- > 0) {
    result = runChild2(kp, cmd, state, exception, value, share, output, delay,
                       timeout, poll, disown, createNewGroup, interruptDelay);
    if (result) {
      break;
    }
  }
  kwsysProcess_Delete(kp);
  return result;
}